

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rbuObjIterPrepareAll(sqlite3rbu *p,RbuObjIter *pIter,int nOffset)

{
  char **ppcVar1;
  int *pRc;
  byte bVar2;
  uchar uVar3;
  sqlite3 *psVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  Mem *pMVar12;
  i64 iVar13;
  i64 iVar14;
  char *pcVar15;
  char *pcVar16;
  uchar *puVar17;
  char **ppcVar18;
  int *piVar19;
  u8 *puVar20;
  ulong uVar21;
  ulong uVar22;
  int i_1;
  int *in_RCX;
  undefined7 uVar24;
  long lVar23;
  sqlite3_stmt *iValue;
  uint uVar25;
  sqlite3_stmt *psVar26;
  uchar *puVar27;
  char *pcVar28;
  long lVar29;
  char *pcVar30;
  Vdbe *pVm;
  uint i;
  uint N;
  char *pcVar31;
  sqlite3_stmt *psVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  int *local_e8;
  char *local_d8;
  char *local_c0;
  sqlite3_stmt *local_a0;
  sqlite3_stmt *local_98;
  char *local_90;
  sqlite3_stmt *pList;
  sqlite3_stmt *psStack_80;
  sqlite3_stmt *local_78;
  sqlite3_stmt *apsStack_70 [2];
  i64 local_60;
  char *local_58;
  sqlite3_stmt *local_50;
  uint local_44;
  sqlite3_stmt **local_40;
  sqlite3rbu *local_38;
  
  if (pIter->pSelect != (sqlite3_stmt *)0x0) goto LAB_00143f83;
  if (pIter->azTblCol == (char **)0x0) {
    local_50 = (sqlite3_stmt *)0x0;
    pcVar9 = pIter->zTbl;
    local_78 = (sqlite3_stmt *)0x0;
    apsStack_70[0] = (sqlite3_stmt *)0x0;
    pList = (sqlite3_stmt *)0x0;
    psStack_80 = (sqlite3_stmt *)0x0;
    pIter->eType = 0;
    local_e8._0_4_ = 0;
    pIter->iPkTnum = 0;
    psVar4 = p->dbMain;
    ppcVar1 = &p->zErrmsg;
    pcVar8 = sqlite3_mprintf("SELECT (sql LIKE \'create virtual%%\'), rootpage  FROM sqlite_master WHERE name=%Q"
                             ,pcVar9);
    iVar5 = prepareFreeAndCollectError(psVar4,&pList,ppcVar1,pcVar8);
    psVar26 = pList;
    p->rc = iVar5;
    if ((iVar5 == 0) && (iVar5 = sqlite3_step(pList), iVar5 == 100)) {
      local_e8._0_4_ = 0;
      pMVar12 = columnMem(psVar26,0);
      iVar13 = sqlite3VdbeIntValue(pMVar12);
      columnMallocFailure(psVar26);
      iVar5 = 5;
      if ((int)iVar13 == 0) {
        pMVar12 = columnMem(psVar26,1);
        iVar13 = sqlite3VdbeIntValue(pMVar12);
        local_e8._0_4_ = (int)iVar13;
        columnMallocFailure(psVar26);
        psVar4 = p->dbMain;
        pcVar8 = sqlite3_mprintf("PRAGMA index_list=%Q",pcVar9);
        iVar5 = prepareFreeAndCollectError(psVar4,&psStack_80,ppcVar1,pcVar8);
        psVar26 = psStack_80;
        p->rc = iVar5;
        if (iVar5 == 0) {
          do {
            iVar5 = sqlite3_step(psVar26);
            if (iVar5 != 100) {
              psVar4 = p->dbMain;
              pcVar9 = sqlite3_mprintf("PRAGMA table_info=%Q",pcVar9);
              iVar5 = prepareFreeAndCollectError(psVar4,apsStack_70,ppcVar1,pcVar9);
              psVar26 = apsStack_70[0];
              p->rc = iVar5;
              if (iVar5 == 0) goto LAB_001442be;
              goto LAB_0014386a;
            }
            puVar17 = sqlite3_column_text(psVar26,3);
            puVar27 = sqlite3_column_text(psVar26,1);
          } while ((puVar27 == (uchar *)0x0 || puVar17 == (uchar *)0x0) || (*puVar17 != 'p'));
          psVar4 = p->dbMain;
          pcVar9 = sqlite3_mprintf("SELECT rootpage FROM sqlite_master WHERE name = %Q",puVar27);
          iVar5 = prepareFreeAndCollectError(psVar4,&local_78,ppcVar1,pcVar9);
          psVar26 = local_78;
          p->rc = iVar5;
          if (iVar5 == 0) {
            iVar6 = sqlite3_step(local_78);
            iVar5 = 4;
            if (iVar6 == 100) {
              iVar5 = sqlite3_column_int(psVar26,0);
              pIter->iPkTnum = iVar5;
              iVar5 = 3;
            }
            goto LAB_00142cc9;
          }
        }
      }
      else {
LAB_00142cc9:
        pIter->eType = iVar5;
      }
    }
LAB_0014386a:
    pRc = &p->rc;
    lVar29 = 0;
    do {
      rbuFinalize(p,(&pList)[lVar29]);
      lVar29 = lVar29 + 1;
    } while (lVar29 != 4);
    if (*pRc != 0) goto LAB_00143f83;
    if (pIter->eType == 0) {
      *pRc = 1;
      pcVar9 = sqlite3_mprintf("no such table: %s",pIter->zTbl);
      *ppcVar1 = pcVar9;
      if (*pRc != 0) goto LAB_00143f83;
    }
    if (pIter->zIdx == (char *)0x0) {
      pIter->iTnum = (int)local_e8;
    }
    psVar4 = p->dbRbu;
    bVar33 = false;
    in_RCX = (int *)sqlite3_mprintf("SELECT * FROM \'%q\'",pIter->zDataTbl);
    iVar5 = prepareFreeAndCollectError(psVar4,&local_50,ppcVar1,(char *)in_RCX);
    psVar26 = local_50;
    p->rc = iVar5;
    if (iVar5 == 0) {
      if (local_50 == (sqlite3_stmt *)0x0) {
        uVar25 = 0;
      }
      else {
        uVar25 = (uint)*(ushort *)(local_50 + 0xc0);
      }
      uVar22 = (ulong)uVar25;
      ppcVar18 = (char **)rbuMalloc(p,uVar22 * 0x17);
      if (ppcVar18 != (char **)0x0) {
        pIter->azTblCol = ppcVar18;
        in_RCX = (int *)(ulong)(uVar25 * 8);
        pIter->azTblType = (char **)((long)ppcVar18 + (long)in_RCX);
        piVar19 = (int *)((long)ppcVar18 + (long)in_RCX + (long)in_RCX);
        pIter->aiSrcOrder = piVar19;
        piVar19 = piVar19 + uVar22;
        pIter->abTblPk = (u8 *)piVar19;
        puVar20 = (u8 *)((long)piVar19 + uVar22);
        pIter->abNotNull = puVar20;
        pIter->abIndexed = puVar20 + uVar22;
      }
      bVar33 = false;
      if ((uVar22 != 0) && (*pRc == 0)) {
        N = 0;
        bVar33 = false;
        do {
          pcVar9 = (char *)columnName(psVar26,N,0,0);
          if (pcVar9 == (char *)0x0) {
LAB_00143bc9:
            pcVar9 = rbuStrndup(pcVar9,pRc);
            iVar5 = pIter->nTblCol;
            in_RCX = (int *)(long)iVar5;
            pIter->aiSrcOrder[(long)in_RCX] = iVar5;
            pIter->nTblCol = iVar5 + 1;
            pIter->azTblCol[(long)in_RCX] = pcVar9;
          }
          else {
            lVar29 = 0;
            do {
              if (""[(byte)"rbu_"[lVar29]] != ""[(byte)pcVar9[lVar29]]) goto LAB_00143bc9;
              lVar29 = lVar29 + 1;
            } while (lVar29 != 4);
            iVar5 = sqlite3StrICmp("rbu_rowid",pcVar9);
            in_RCX = (int *)0x0;
            if (iVar5 == 0) {
              bVar33 = true;
            }
          }
        } while ((*pRc == 0) && (N = N + 1, N < uVar25));
      }
    }
    sqlite3_finalize(psVar26);
    local_50 = (sqlite3_stmt *)0x0;
    if (*pRc == 0) {
      if ((p->zTarget != (char *)0x0) &&
         (in_RCX = (int *)0x0, bVar33 != ((pIter->eType & 0xfffffffbU) == 1))) {
        *pRc = 1;
        pcVar9 = "may not have";
        if (bVar33 == false) {
          pcVar9 = "requires";
        }
        psVar26 = (sqlite3_stmt *)0x0;
        pcVar9 = sqlite3_mprintf("table %q %s rbu_rowid column",pIter->zDataTbl,pcVar9);
        *ppcVar1 = pcVar9;
        if (*pRc != 0) goto LAB_00143a14;
      }
      psVar4 = p->dbMain;
      in_RCX = (int *)sqlite3_mprintf("PRAGMA table_info(%Q)",pIter->zTbl);
      iVar5 = prepareFreeAndCollectError(psVar4,&local_50,ppcVar1,(char *)in_RCX);
      psVar26 = local_50;
      p->rc = iVar5;
      if (iVar5 == 0) {
        iVar5 = 0;
        do {
          iVar6 = sqlite3_step(psVar26);
          if ((iVar6 != 100) || (puVar17 = sqlite3_column_text(psVar26,1), puVar17 == (uchar *)0x0))
          break;
          iVar6 = pIter->nTblCol;
          iVar7 = iVar5;
          if (iVar5 < iVar6) {
            ppcVar18 = pIter->azTblCol;
            lVar29 = 0;
            do {
              iVar7 = strcmp((char *)puVar17,ppcVar18[iVar5 + lVar29]);
              if (iVar7 == 0) {
                iVar7 = (int)lVar29 + iVar5;
                goto LAB_00143db3;
              }
              lVar29 = lVar29 + 1;
            } while ((long)iVar6 - (long)iVar5 != lVar29);
LAB_00143db8:
            *pRc = 1;
            pcVar9 = sqlite3_mprintf("column missing from %q: %s",pIter->zDataTbl,puVar17);
            *ppcVar1 = pcVar9;
          }
          else {
LAB_00143db3:
            if (iVar7 == iVar6) goto LAB_00143db8;
            pMVar12 = columnMem(psVar26,5);
            uVar22 = sqlite3VdbeIntValue(pMVar12);
            columnMallocFailure(psVar26);
            pMVar12 = columnMem(psVar26,3);
            uVar21 = sqlite3VdbeIntValue(pMVar12);
            columnMallocFailure(psVar26);
            puVar17 = sqlite3_column_text(psVar26,2);
            if (iVar7 != iVar5) {
              piVar19 = pIter->aiSrcOrder;
              iVar6 = piVar19[iVar7];
              piVar19[iVar7] = piVar19[iVar5];
              piVar19[iVar5] = iVar6;
              ppcVar18 = pIter->azTblCol;
              pcVar9 = ppcVar18[iVar7];
              ppcVar18[iVar7] = ppcVar18[iVar5];
              pIter->azTblCol[iVar5] = pcVar9;
            }
            pcVar9 = rbuStrndup((char *)puVar17,pRc);
            pIter->azTblType[iVar5] = pcVar9;
            pIter->abTblPk[iVar5] = (uVar22 & 0xffffffff) != 0;
            in_RCX = (int *)(uVar21 & 0xff | uVar22 & 0xffffffff);
            pIter->abNotNull[iVar5] = in_RCX != (int *)0x0;
            iVar5 = iVar5 + 1;
          }
        } while (*pRc == 0);
      }
    }
    else {
      psVar26 = (sqlite3_stmt *)0x0;
    }
LAB_00143a14:
    rbuFinalize(p,psVar26);
    pList = (sqlite3_stmt *)0x0;
    if (p->rc == 0) {
      memcpy(pIter->abIndexed,pIter->abTblPk,(long)pIter->nTblCol);
      psVar4 = p->dbMain;
      pcVar9 = sqlite3_mprintf("PRAGMA main.index_list = %Q",pIter->zTbl);
      iVar5 = prepareFreeAndCollectError(psVar4,&pList,ppcVar1,pcVar9);
      psVar26 = pList;
      p->rc = iVar5;
      piVar19 = &pIter->nIndex;
      pIter->nIndex = 0;
      bVar33 = true;
      in_RCX = piVar19;
      if (iVar5 == 0) {
        bVar33 = true;
        do {
          iVar5 = sqlite3_step(psVar26);
          if (iVar5 != 100) break;
          puVar17 = sqlite3_column_text(psVar26,1);
          pMVar12 = columnMem(psVar26,4);
          iVar13 = sqlite3VdbeIntValue(pMVar12);
          columnMallocFailure(psVar26);
          local_a0 = (sqlite3_stmt *)0x0;
          if (puVar17 == (uchar *)0x0) break;
          if ((int)iVar13 != 0) {
            memset(pIter->abIndexed,1,(long)pIter->nTblCol);
          }
          psVar4 = p->dbMain;
          in_RCX = (int *)sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puVar17);
          iVar5 = prepareFreeAndCollectError(psVar4,&local_a0,ppcVar1,(char *)in_RCX);
          psVar32 = local_a0;
          p->rc = iVar5;
          while ((iVar5 == 0 && (iVar5 = sqlite3_step(psVar32), iVar5 == 100))) {
            pMVar12 = columnMem(psVar32,1);
            iVar13 = sqlite3VdbeIntValue(pMVar12);
            columnMallocFailure(psVar32);
            if (-1 < (int)(uint)iVar13) {
              pIter->abIndexed[(uint)iVar13 & 0x7fffffff] = '\x01';
            }
            iVar5 = *pRc;
          }
          rbuFinalize(p,psVar32);
          *piVar19 = *piVar19 + 1;
          bVar33 = false;
        } while (p->rc == 0);
      }
    }
    else {
      pIter->nIndex = 0;
      bVar33 = true;
    }
    local_e8 = &pIter->nIndex;
    if (pIter->eType == 4) {
      *local_e8 = *local_e8 + -1;
    }
    rbuFinalize(p,pList);
    if (bVar33) {
      pIter->abIndexed = (u8 *)0x0;
    }
  }
  if (p->rc != 0) goto LAB_00143f83;
  uVar25 = pIter->iTnum;
  pcVar9 = pIter->zIdx;
  if (nOffset == 0) {
LAB_00142bab:
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = sqlite3_mprintf(" LIMIT -1 OFFSET %d",(ulong)(uint)nOffset);
    if (pcVar8 == (char *)0x0) {
      p->rc = 7;
      goto LAB_00142bab;
    }
  }
  local_40 = &pIter->pSelect;
  ppcVar1 = &p->zErrmsg;
  if (pcVar9 == (char *)0x0) {
    iVar5 = pIter->eType;
    uVar24 = (undefined7)((ulong)in_RCX >> 8);
    uVar25 = (uint)CONCAT71(uVar24,1);
    if ((iVar5 != 1) && (iVar5 != 5)) {
      if (iVar5 == 3) {
        uVar25 = (uint)CONCAT71(uVar24,p->zTarget == (char *)0x0);
      }
      else {
        uVar25 = 0;
      }
    }
    local_60 = CONCAT44(local_60._4_4_,uVar25);
    local_90 = pIter->zTbl;
    pcVar9 = rbuObjIterGetBindlist(p,(uVar25 & 0xff) + pIter->nTblCol);
    pcVar15 = rbuObjIterGetWhere(p,pIter);
    pcVar16 = rbuObjIterGetOldlist(p,pIter,"old");
    pcVar10 = rbuObjIterGetOldlist(p,pIter,"new");
    iVar5 = pIter->nTblCol;
    if (iVar5 < 1) {
      local_d8 = (char *)0x0;
    }
    else {
      lVar29 = 0;
      local_d8 = (char *)0x0;
      pcVar11 = "";
      do {
        local_d8 = rbuMPrintf(p,"%z%s\"%w\"",local_d8,pcVar11,pIter->azTblCol[lVar29]);
        lVar29 = lVar29 + 1;
        iVar5 = pIter->nTblCol;
        pcVar11 = ", ";
      } while (lVar29 < iVar5);
    }
    pIter->nCol = iVar5;
    iVar5 = p->rc;
    if (iVar5 == 0) {
      pcVar11 = "";
      if (pIter->eType != 5) {
        local_98 = (sqlite3_stmt *)CONCAT44(local_98._4_4_,pIter->iTnum);
        sqlite3_test_control(0x19,p->dbMain,"main",0);
        if (p->rc == 0) {
          lVar29 = 0;
          pcVar11 = "";
          local_e8 = (int *)0x0;
          do {
            if (pIter->nTblCol <= lVar29) {
              if (pIter->eType == 4) {
                pList = (sqlite3_stmt *)0x0;
                local_a0 = (sqlite3_stmt *)0x0;
                psVar4 = p->dbMain;
                pcVar11 = sqlite3_mprintf("PRAGMA main.index_list = %Q",pIter->zTbl);
                iVar5 = prepareFreeAndCollectError(psVar4,&pList,ppcVar1,pcVar11);
                psVar26 = pList;
                p->rc = iVar5;
                psVar32 = (sqlite3_stmt *)0x0;
                if (iVar5 != 0) goto LAB_0014411b;
                goto LAB_001440e1;
              }
              break;
            }
            pcVar31 = pIter->azTblCol[lVar29];
            pList = (sqlite3_stmt *)0x0;
            iVar5 = sqlite3_table_column_metadata
                              (p->dbMain,"main",pIter->zTbl,pcVar31,(char **)0x0,(char **)&pList,
                               (int *)0x0,(int *)0x0,(int *)0x0);
            p->rc = iVar5;
            pcVar28 = "";
            if ((pIter->eType == 2) && (pcVar28 = "PRIMARY KEY ", pIter->abTblPk[lVar29] == '\0')) {
              pcVar28 = "";
            }
            pcVar30 = " NOT NULL";
            if (pIter->abNotNull[lVar29] == '\0') {
              pcVar30 = "";
            }
            local_e8 = (int *)rbuMPrintf(p,"%z%s\"%w\" %s %sCOLLATE %Q%s",local_e8,pcVar11,pcVar31,
                                         pIter->azTblType[lVar29],pcVar28,pList,pcVar30);
            lVar29 = lVar29 + 1;
            pcVar11 = ", ";
          } while (p->rc == 0);
        }
        else {
          local_e8 = (int *)0x0;
        }
        goto LAB_00144138;
      }
      goto LAB_00143170;
    }
    goto LAB_00143144;
  }
  local_58 = pIter->zTbl;
  iVar5 = p->rc;
  pList = (sqlite3_stmt *)0x0;
  local_44 = uVar25;
  if (iVar5 == 0) {
    psVar4 = p->dbMain;
    pcVar9 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",pIter->zIdx);
    iVar5 = prepareFreeAndCollectError(psVar4,&pList,ppcVar1,pcVar9);
    if (iVar5 != 0) goto LAB_00142d47;
    pcVar11 = "";
    local_d8 = (char *)0x0;
    pcVar15 = (char *)0x0;
    pcVar9 = (char *)0x0;
    pcVar10 = "";
    local_e8 = (int *)0x0;
    pcVar16 = (char *)0x0;
    local_98 = pList;
    local_38 = p;
    do {
      p = local_38;
      psVar26 = local_98;
      iVar5 = sqlite3_step(local_98);
      if (iVar5 != 100) {
        iVar5 = sqlite3_finalize(psVar26);
        if (iVar5 == 0) goto LAB_00142d92;
        goto LAB_00142d5b;
      }
      local_90 = pcVar9;
      pMVar12 = columnMem(psVar26,1);
      iVar13 = sqlite3VdbeIntValue(pMVar12);
      columnMallocFailure(psVar26);
      pMVar12 = columnMem(psVar26,3);
      iVar14 = sqlite3VdbeIntValue(pMVar12);
      columnMallocFailure(psVar26);
      puVar17 = sqlite3_column_text(psVar26,4);
      if ((int)(uint)iVar13 < 0) {
        if (pIter->eType == 2) {
          lVar29 = 0;
          do {
            lVar23 = lVar29;
            lVar29 = lVar23 + 1;
          } while (pIter->abTblPk[lVar23] == '\0');
          pcVar31 = pIter->azTblCol[lVar23];
        }
        else {
          pcVar31 = "rbu_rowid";
          if (p->zTarget == (char *)0x0) {
            pcVar31 = "_rowid_";
          }
        }
        local_c0 = "INTEGER";
      }
      else {
        uVar25 = (uint)iVar13 & 0x7fffffff;
        pcVar31 = pIter->azTblCol[uVar25];
        local_c0 = pIter->azTblType[uVar25];
      }
      local_60 = iVar14;
      local_d8 = sqlite3_mprintf("%z%s\"%w\" COLLATE %Q",local_d8,pcVar11,pcVar31,puVar17);
      psVar26 = local_98;
      if (pIter->bUnique == 0) {
LAB_001434e6:
        pcVar9 = " DESC";
        if ((int)local_60 == 0) {
          pcVar9 = "";
        }
        pcVar9 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\"%s",local_90,pcVar11,local_e8,pcVar31,pcVar9);
      }
      else {
        pMVar12 = columnMem(local_98,5);
        iVar13 = sqlite3VdbeIntValue(pMVar12);
        columnMallocFailure(psVar26);
        pcVar9 = local_90;
        if ((int)iVar13 != 0) goto LAB_001434e6;
      }
      pcVar15 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\" %s COLLATE %Q",pcVar15,pcVar11,local_e8,
                                pcVar31,local_c0,puVar17);
      pcVar16 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\" IS ?",pcVar16,pcVar10,local_e8);
      auVar34._0_4_ = -(uint)((int)((ulong)local_d8 >> 0x20) == 0 && (int)local_d8 == 0);
      auVar34._4_4_ = -(uint)((int)pcVar9 == 0 && (int)((ulong)pcVar9 >> 0x20) == 0);
      auVar34._8_4_ = -(uint)((int)((ulong)pcVar15 >> 0x20) == 0 && (int)pcVar15 == 0);
      auVar34._12_4_ = -(uint)((int)pcVar16 == 0 && (int)((ulong)pcVar16 >> 0x20) == 0);
      iVar5 = movmskps((int)pcVar16,auVar34);
      local_e8 = (int *)(ulong)((int)local_e8 + 1);
      pcVar10 = " AND ";
      pcVar11 = ", ";
    } while (iVar5 == 0);
    iVar5 = 7;
    p = local_38;
    psVar26 = local_98;
  }
  else {
LAB_00142d47:
    local_e8 = (int *)0x0;
    pcVar16 = (char *)0x0;
    pcVar9 = (char *)0x0;
    pcVar15 = (char *)0x0;
    local_d8 = (char *)0x0;
    psVar26 = pList;
  }
  sqlite3_finalize(psVar26);
LAB_00142d5b:
  sqlite3_free(local_d8);
  sqlite3_free(pcVar15);
  sqlite3_free(pcVar9);
  sqlite3_free(pcVar16);
  p->rc = iVar5;
  pcVar16 = (char *)0x0;
  pcVar9 = (char *)0x0;
  pcVar15 = (char *)0x0;
  local_d8 = (char *)0x0;
LAB_00142d92:
  pcVar10 = rbuObjIterGetBindlist(p,(int)local_e8);
  pList = (sqlite3_stmt *)0x0;
  iVar5 = p->rc;
  if ((iVar5 == 0) &&
     (iVar5 = prepareAndCollectError
                        (p->dbMain,&pList,ppcVar1,
                         "SELECT trim(sql) FROM sqlite_master WHERE type=\'index\' AND name=?"),
     psVar26 = pList, iVar5 == 0)) {
    iVar5 = bindText(pList,1,pIter->zIdx,-1,(_func_void_void_ptr *)0x0,'\x01');
    local_a0 = (sqlite3_stmt *)CONCAT44(local_a0._4_4_,iVar5);
    if (iVar5 == 0) {
      iVar5 = sqlite3_step(psVar26);
      if (iVar5 == 100) {
        iVar5 = 0;
        puVar17 = sqlite3_column_text(psVar26,0);
        if (puVar17 != (uchar *)0x0) {
          uVar22 = 0;
          do {
            uVar25 = (uint)uVar22;
            bVar2 = puVar17[(int)uVar25];
            if (bVar2 < 0x5b) {
              switch(bVar2) {
              case 0x22:
              case 0x27:
switchD_001437da_caseD_22:
                do {
                  do {
                    lVar29 = (long)(int)uVar22;
                    uVar22 = lVar29 + 1U & 0xffffffff;
                  } while (puVar17[lVar29 + 1] != bVar2);
                  uVar22 = lVar29 + 2;
                } while (puVar17[lVar29 + 2] == bVar2);
                uVar25 = (uint)(lVar29 + 1U);
                break;
              case 0x23:
              case 0x24:
              case 0x25:
              case 0x26:
                break;
              case 0x28:
                iVar5 = iVar5 + 1;
                break;
              case 0x29:
                iVar5 = iVar5 + -1;
                if (iVar5 == 0) {
                  if (puVar17[(long)(int)uVar25 + 1] != '\0') {
                    local_c0 = rbuStrndup((char *)(puVar17 + (long)(int)uVar25 + 1),(int *)&local_a0
                                         );
                    iVar6 = (int)local_a0;
                    iVar5 = sqlite3_finalize(psVar26);
                    if (iVar6 != 0) {
                      iVar5 = iVar6;
                    }
                    goto LAB_00142de8;
                  }
                  goto LAB_00144333;
                }
                break;
              default:
                if (bVar2 == 0) goto LAB_00144333;
              }
            }
            else {
              if (bVar2 == 0x60) goto switchD_001437da_caseD_22;
              if (bVar2 == 0x5b) {
                puVar27 = puVar17 + (long)(int)uVar25 + 1;
                do {
                  uVar25 = (int)uVar22 + 1;
                  uVar22 = (ulong)uVar25;
                  uVar3 = *puVar27;
                  puVar27 = puVar27 + 1;
                } while (uVar3 != ']');
              }
            }
            uVar22 = (ulong)(uVar25 + 1);
          } while( true );
        }
      }
LAB_00144333:
      iVar5 = sqlite3_finalize(psVar26);
    }
    else {
      sqlite3_finalize(psVar26);
    }
    local_c0 = (char *)0x0;
  }
  else {
    local_c0 = (char *)0x0;
  }
LAB_00142de8:
  p->rc = iVar5;
  sqlite3_test_control(0x19,p->dbMain,"main",0,1);
  sqlite3_test_control(0x19,p->dbMain,"main",1,(ulong)local_44);
  rbuMPrintfExec(p,p->dbMain,"CREATE TABLE \"rbu_imp_%w\"( %s, PRIMARY KEY( %s ) ) WITHOUT ROWID",
                 local_58,pcVar15,pcVar9);
  sqlite3_test_control(0x19,p->dbMain,"main",0,0);
  pIter->nCol = (int)local_e8;
  iVar5 = p->rc;
  if (iVar5 == 0) {
    psVar4 = p->dbMain;
    pcVar11 = sqlite3_mprintf("INSERT INTO \"rbu_imp_%w\" VALUES(%s)",local_58,pcVar10);
    iVar5 = prepareFreeAndCollectError(psVar4,&pIter->pInsert,ppcVar1,pcVar11);
    p->rc = iVar5;
  }
  if (p->zTarget == (char *)0x0) {
LAB_00142f11:
    if (iVar5 == 0) {
      if (p->zTarget == (char *)0x0) {
        pcVar11 = sqlite3_mprintf("SELECT %s, 0 AS rbu_control FROM \'%q\' %s ORDER BY %s%s",
                                  local_d8,pIter->zDataTbl,local_c0,local_d8,pcVar8);
      }
      else if ((pIter->eType | 2U) == 3) {
        pcVar11 = sqlite3_mprintf("SELECT %s, rbu_control FROM %s.\'rbu_tmp_%q\' %s ORDER BY %s%s",
                                  local_d8,p->zStateDb,pIter->zDataTbl,local_c0,local_d8,pcVar8);
      }
      else {
        pcVar11 = "AND";
        if (local_c0 == (char *)0x0) {
          pcVar11 = "WHERE";
        }
        pcVar11 = sqlite3_mprintf("SELECT %s, rbu_control FROM %s.\'rbu_tmp_%q\' %s UNION ALL SELECT %s, rbu_control FROM \'%q\' %s %s typeof(rbu_control)=\'integer\' AND rbu_control!=1 ORDER BY %s%s"
                                  ,local_d8,p->zStateDb,pIter->zDataTbl,local_c0,local_d8,
                                  pIter->zDataTbl,local_c0,pcVar11,local_d8,pcVar8);
      }
      iVar5 = prepareFreeAndCollectError(p->dbRbu,local_40,ppcVar1,pcVar11);
      p->rc = iVar5;
    }
  }
  else if (iVar5 == 0) {
    psVar4 = p->dbMain;
    pcVar11 = sqlite3_mprintf("DELETE FROM \"rbu_imp_%w\" WHERE %s",local_58,pcVar16);
    iVar5 = prepareFreeAndCollectError(psVar4,&pIter->pDelete,ppcVar1,pcVar11);
    p->rc = iVar5;
    goto LAB_00142f11;
  }
  sqlite3_free(pcVar15);
  sqlite3_free(pcVar9);
  sqlite3_free(pcVar16);
  sqlite3_free(pcVar10);
  sqlite3_free(local_c0);
  goto LAB_00143f71;
  while( true ) {
    pMVar12 = columnMem(psVar26,5);
    iVar13 = sqlite3VdbeIntValue(pMVar12);
    columnMallocFailure(psVar26);
    if (0 < (int)iVar13) break;
LAB_001442be:
    iVar5 = sqlite3_step(psVar26);
    if (iVar5 != 100) {
      iVar5 = 1;
      goto LAB_00142cc9;
    }
  }
  iVar5 = 2;
  goto LAB_00142cc9;
LAB_001440e1:
  iVar5 = sqlite3_step(psVar26);
  psVar32 = (sqlite3_stmt *)0x0;
  if (iVar5 != 100) goto LAB_0014411b;
  puVar17 = sqlite3_column_text(psVar26,3);
  if ((((puVar17 != (uchar *)0x0) && (*puVar17 == 'p')) && (puVar17[1] == 'k')) &&
     (puVar17[2] == '\0')) {
    puVar17 = sqlite3_column_text(psVar26,1);
    if (puVar17 == (uchar *)0x0) {
      psVar32 = (sqlite3_stmt *)0x0;
    }
    else {
      psVar4 = p->dbMain;
      pcVar11 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puVar17);
      iVar5 = prepareFreeAndCollectError(psVar4,&local_a0,ppcVar1,pcVar11);
      p->rc = iVar5;
      psVar32 = local_a0;
    }
    goto LAB_0014411b;
  }
  if (p->rc != 0) goto LAB_0014411b;
  goto LAB_001440e1;
LAB_0014411b:
  rbuFinalize(p,psVar26);
  if (p->rc == 0) {
    pcVar31 = "PRIMARY KEY(";
    pcVar11 = (char *)0x0;
    do {
      iVar5 = sqlite3_step(psVar32);
      if (iVar5 != 100) break;
      pMVar12 = columnMem(psVar32,5);
      iVar13 = sqlite3VdbeIntValue(pMVar12);
      columnMallocFailure(psVar32);
      if ((int)iVar13 != 0) {
        puVar17 = sqlite3_column_text(psVar32,2);
        pMVar12 = columnMem(psVar32,3);
        iVar13 = sqlite3VdbeIntValue(pMVar12);
        columnMallocFailure(psVar32);
        pcVar28 = " DESC";
        if ((int)iVar13 == 0) {
          pcVar28 = "";
        }
        pcVar11 = rbuMPrintf(p,"%z%s\"%w\"%s",pcVar11,pcVar31,puVar17,pcVar28);
        pcVar31 = ", ";
      }
    } while (p->rc == 0);
  }
  else {
    pcVar11 = (char *)0x0;
  }
  pcVar11 = rbuMPrintf(p,"%z)",pcVar11);
  rbuFinalize(p,psVar32);
  if (pcVar11 != (char *)0x0) {
    local_e8 = (int *)rbuMPrintf(p,"%z, %z",local_e8,pcVar11);
  }
LAB_00144138:
  sqlite3_test_control(0x19,p->dbMain,"main",1,(ulong)local_98 & 0xffffffff);
  pcVar11 = " WITHOUT ROWID";
  if (pIter->eType != 4) {
    pcVar11 = "";
  }
  rbuMPrintfExec(p,p->dbMain,"CREATE TABLE \"rbu_imp_%w\"(%z)%s",pIter->zTbl,local_e8,pcVar11);
  sqlite3_test_control(0x19,p->dbMain,"main",0,0);
  iVar5 = p->rc;
  if (iVar5 == 0) {
    if (pIter->eType == 3) {
      iValue = (sqlite3_stmt *)(long)pIter->iPkTnum;
      pList = (sqlite3_stmt *)0x0;
      local_a0 = (sqlite3_stmt *)0x0;
      iVar5 = prepareAndCollectError
                        (p->dbMain,&pList,ppcVar1,
                         "SELECT name FROM sqlite_master WHERE rootpage = ?");
      psVar26 = pList;
      p->rc = iVar5;
      psVar32 = (sqlite3_stmt *)0x0;
      local_98 = iValue;
      if (iVar5 == 0) {
        sqlite3_bind_int64(pList,1,(sqlite_int64)iValue);
        iVar5 = sqlite3_step(psVar26);
        psVar32 = (sqlite3_stmt *)0x0;
        if ((iVar5 == 100) && (puVar17 = sqlite3_column_text(psVar26,0), puVar17 != (uchar *)0x0)) {
          psVar4 = p->dbMain;
          pcVar11 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puVar17);
          iVar5 = prepareFreeAndCollectError(psVar4,&local_a0,ppcVar1,pcVar11);
          p->rc = iVar5;
          psVar32 = local_a0;
        }
      }
      rbuFinalize(p,psVar26);
      if (p->rc == 0) {
        pcVar31 = "";
        pcVar11 = (char *)0x0;
        local_e8 = (int *)0x0;
        do {
          iVar5 = sqlite3_step(psVar32);
          if (iVar5 != 100) break;
          pMVar12 = columnMem(psVar32,5);
          iVar13 = sqlite3VdbeIntValue(pMVar12);
          columnMallocFailure(psVar32);
          if ((int)iVar13 != 0) {
            pMVar12 = columnMem(psVar32,1);
            uVar22 = sqlite3VdbeIntValue(pMVar12);
            columnMallocFailure(psVar32);
            pMVar12 = columnMem(psVar32,3);
            iVar13 = sqlite3VdbeIntValue(pMVar12);
            columnMallocFailure(psVar32);
            puVar17 = sqlite3_column_text(psVar32,4);
            pcVar11 = rbuMPrintf(p,"%z%sc%d %s COLLATE %Q",pcVar11,pcVar31,uVar22 & 0xffffffff,
                                 pIter->azTblType[(int)uVar22],puVar17);
            pcVar28 = " DESC";
            if ((int)iVar13 == 0) {
              pcVar28 = "";
            }
            local_e8 = (int *)rbuMPrintf(p,"%z%sc%d%s",local_e8,pcVar31,uVar22 & 0xffffffff,pcVar28)
            ;
            pcVar31 = ", ";
          }
        } while (p->rc == 0);
      }
      else {
        local_e8 = (int *)0x0;
        pcVar11 = (char *)0x0;
      }
      pcVar11 = rbuMPrintf(p,"%z, id INTEGER",pcVar11);
      rbuFinalize(p,psVar32);
      sqlite3_test_control(0x19,p->dbMain,"main",1,local_98);
      rbuMPrintfExec(p,p->dbMain,"CREATE TABLE rbu_imposter2(%z, PRIMARY KEY(%z)) WITHOUT ROWID",
                     pcVar11,local_e8);
      sqlite3_test_control(0x19,p->dbMain,"main",0,0);
      iVar5 = p->rc;
      pcVar11 = "rbu_imp_";
      if (pIter->eType == 5) {
        pcVar11 = "";
      }
      if (iVar5 != 0) goto LAB_001431c7;
    }
    else {
      pcVar11 = "rbu_imp_";
      if (pIter->eType == 5) {
        pcVar11 = "";
      }
    }
LAB_00143170:
    pcVar31 = "";
    psVar4 = p->dbMain;
    if ((char)local_60 != '\0') {
      pcVar31 = ", _rowid_";
    }
    pcVar31 = sqlite3_mprintf("INSERT INTO \"%s%w\"(%s%s) VALUES(%s)",pcVar11,local_90,local_d8,
                              pcVar31,pcVar9);
    iVar5 = prepareFreeAndCollectError(psVar4,&pIter->pInsert,ppcVar1,pcVar31);
    p->rc = iVar5;
  }
  else {
LAB_00143144:
    pcVar11 = "rbu_imp_";
    if (pIter->eType == 5) {
      pcVar11 = "";
    }
  }
LAB_001431c7:
  if (p->zTarget != (char *)0x0) {
    if (iVar5 == 0) {
      psVar4 = p->dbMain;
      pcVar31 = sqlite3_mprintf("DELETE FROM \"%s%w\" WHERE %s",pcVar11,local_90,pcVar15);
      iVar5 = prepareFreeAndCollectError(psVar4,&pIter->pDelete,ppcVar1,pcVar31);
      p->rc = iVar5;
      if (p->zTarget == (char *)0x0) goto LAB_001436c9;
    }
    if (pIter->abIndexed != (u8 *)0x0) {
      pcVar31 = ", rbu_rowid";
      if ((pIter->eType - 1U & 0xfffffffd) != 0) {
        pcVar31 = "";
      }
      pcVar28 = ", 0 AS rbu_rowid";
      if (pIter->eType != 3) {
        pcVar28 = "";
      }
      rbuMPrintfExec(p,p->dbRbu,
                     "CREATE TABLE IF NOT EXISTS %s.\'rbu_tmp_%q\' AS SELECT *%s FROM \'%q\' WHERE 0;"
                     ,p->zStateDb,pIter->zDataTbl,pcVar28,pIter->zDataTbl);
      pcVar28 = local_90;
      rbuMPrintfExec(p,p->dbMain,
                     "CREATE TEMP TRIGGER rbu_delete_tr BEFORE DELETE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(3, %s);END;CREATE TEMP TRIGGER rbu_update1_tr BEFORE UPDATE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(3, %s);END;CREATE TEMP TRIGGER rbu_update2_tr AFTER UPDATE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(4, %s);END;"
                     ,pcVar11,local_90,pcVar16,pcVar11,local_90,pcVar16,pcVar11,local_90,pcVar10);
      uVar25 = pIter->eType;
      if ((uVar25 | 2) == 3) {
        rbuMPrintfExec(p,p->dbMain,
                       "CREATE TEMP TRIGGER rbu_insert_tr AFTER INSERT ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(0, %s);END;"
                       ,pcVar11,pcVar28,pcVar10);
        uVar25 = pIter->eType;
      }
      pcVar11 = rbuObjIterGetBindlist(p,pIter->nTblCol + (uint)((uVar25 & 0xfffffffd) == 1) + 1);
      if (pcVar11 == (char *)0x0) {
        iVar5 = p->rc;
      }
      else {
        psVar4 = p->dbRbu;
        pcVar11 = sqlite3_mprintf("INSERT INTO %s.\'rbu_tmp_%q\'(rbu_control,%s%s) VALUES(%z)",
                                  p->zStateDb,pIter->zDataTbl,local_d8,pcVar31,pcVar11);
        iVar5 = prepareFreeAndCollectError(psVar4,&pIter->pTmpInsert,ppcVar1,pcVar11);
        p->rc = iVar5;
      }
    }
  }
LAB_001436c9:
  if (iVar5 == 0) {
    bVar33 = p->zTarget == (char *)0x0;
    pcVar11 = ",rbu_rowid";
    if (bVar33) {
      pcVar11 = ",_rowid_ ";
    }
    pcVar31 = "0 AS ";
    if (!bVar33) {
      pcVar31 = "";
    }
    psVar4 = p->dbRbu;
    if ((char)local_60 == '\0') {
      pcVar11 = "";
    }
    pcVar11 = sqlite3_mprintf("SELECT %s,%s rbu_control%s FROM \'%q\'%s",local_d8,pcVar31,pcVar11,
                              pIter->zDataTbl,pcVar8);
    iVar5 = prepareFreeAndCollectError(psVar4,local_40,ppcVar1,pcVar11);
    p->rc = iVar5;
  }
  sqlite3_free(pcVar15);
  sqlite3_free(pcVar16);
  sqlite3_free(pcVar10);
  sqlite3_free(pcVar9);
LAB_00143f71:
  sqlite3_free(local_d8);
  sqlite3_free(pcVar8);
LAB_00143f83:
  return p->rc;
}

Assistant:

static int rbuObjIterPrepareAll(
  sqlite3rbu *p, 
  RbuObjIter *pIter,
  int nOffset                     /* Add "LIMIT -1 OFFSET $nOffset" to SELECT */
){
  assert( pIter->bCleanup==0 );
  if( pIter->pSelect==0 && rbuObjIterCacheTableInfo(p, pIter)==SQLITE_OK ){
    const int tnum = pIter->iTnum;
    char *zCollist = 0;           /* List of indexed columns */
    char **pz = &p->zErrmsg;
    const char *zIdx = pIter->zIdx;
    char *zLimit = 0;

    if( nOffset ){
      zLimit = sqlite3_mprintf(" LIMIT -1 OFFSET %d", nOffset);
      if( !zLimit ) p->rc = SQLITE_NOMEM;
    }

    if( zIdx ){
      const char *zTbl = pIter->zTbl;
      char *zImposterCols = 0;    /* Columns for imposter table */
      char *zImposterPK = 0;      /* Primary key declaration for imposter */
      char *zWhere = 0;           /* WHERE clause on PK columns */
      char *zBind = 0;
      char *zPart = 0;
      int nBind = 0;

      assert( pIter->eType!=RBU_PK_VTAB );
      zCollist = rbuObjIterGetIndexCols(
          p, pIter, &zImposterCols, &zImposterPK, &zWhere, &nBind
      );
      zBind = rbuObjIterGetBindlist(p, nBind);
      zPart = rbuObjIterGetIndexWhere(p, pIter);

      /* Create the imposter table used to write to this index. */
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 0, 1);
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 1,tnum);
      rbuMPrintfExec(p, p->dbMain,
          "CREATE TABLE \"rbu_imp_%w\"( %s, PRIMARY KEY( %s ) ) WITHOUT ROWID",
          zTbl, zImposterCols, zImposterPK
      );
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 0, 0);

      /* Create the statement to insert index entries */
      pIter->nCol = nBind;
      if( p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(
            p->dbMain, &pIter->pInsert, &p->zErrmsg,
          sqlite3_mprintf("INSERT INTO \"rbu_imp_%w\" VALUES(%s)", zTbl, zBind)
        );
      }

      /* And to delete index entries */
      if( rbuIsVacuum(p)==0 && p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(
            p->dbMain, &pIter->pDelete, &p->zErrmsg,
          sqlite3_mprintf("DELETE FROM \"rbu_imp_%w\" WHERE %s", zTbl, zWhere)
        );
      }

      /* Create the SELECT statement to read keys in sorted order */
      if( p->rc==SQLITE_OK ){
        char *zSql;
        if( rbuIsVacuum(p) ){
          zSql = sqlite3_mprintf(
              "SELECT %s, 0 AS rbu_control FROM '%q' %s ORDER BY %s%s",
              zCollist, 
              pIter->zDataTbl,
              zPart, zCollist, zLimit
          );
        }else

        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          zSql = sqlite3_mprintf(
              "SELECT %s, rbu_control FROM %s.'rbu_tmp_%q' %s ORDER BY %s%s",
              zCollist, p->zStateDb, pIter->zDataTbl,
              zPart, zCollist, zLimit
          );
        }else{
          zSql = sqlite3_mprintf(
              "SELECT %s, rbu_control FROM %s.'rbu_tmp_%q' %s "
              "UNION ALL "
              "SELECT %s, rbu_control FROM '%q' "
              "%s %s typeof(rbu_control)='integer' AND rbu_control!=1 "
              "ORDER BY %s%s",
              zCollist, p->zStateDb, pIter->zDataTbl, zPart,
              zCollist, pIter->zDataTbl, 
              zPart,
              (zPart ? "AND" : "WHERE"),
              zCollist, zLimit
          );
        }
        p->rc = prepareFreeAndCollectError(p->dbRbu, &pIter->pSelect, pz, zSql);
      }

      sqlite3_free(zImposterCols);
      sqlite3_free(zImposterPK);
      sqlite3_free(zWhere);
      sqlite3_free(zBind);
      sqlite3_free(zPart);
    }else{
      int bRbuRowid = (pIter->eType==RBU_PK_VTAB)
                    ||(pIter->eType==RBU_PK_NONE)
                    ||(pIter->eType==RBU_PK_EXTERNAL && rbuIsVacuum(p));
      const char *zTbl = pIter->zTbl;       /* Table this step applies to */
      const char *zWrite;                   /* Imposter table name */

      char *zBindings = rbuObjIterGetBindlist(p, pIter->nTblCol + bRbuRowid);
      char *zWhere = rbuObjIterGetWhere(p, pIter);
      char *zOldlist = rbuObjIterGetOldlist(p, pIter, "old");
      char *zNewlist = rbuObjIterGetOldlist(p, pIter, "new");

      zCollist = rbuObjIterGetCollist(p, pIter);
      pIter->nCol = pIter->nTblCol;

      /* Create the imposter table or tables (if required). */
      rbuCreateImposterTable(p, pIter);
      rbuCreateImposterTable2(p, pIter);
      zWrite = (pIter->eType==RBU_PK_VTAB ? "" : "rbu_imp_");

      /* Create the INSERT statement to write to the target PK b-tree */
      if( p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(p->dbMain, &pIter->pInsert, pz,
            sqlite3_mprintf(
              "INSERT INTO \"%s%w\"(%s%s) VALUES(%s)", 
              zWrite, zTbl, zCollist, (bRbuRowid ? ", _rowid_" : ""), zBindings
            )
        );
      }

      /* Create the DELETE statement to write to the target PK b-tree.
      ** Because it only performs INSERT operations, this is not required for
      ** an rbu vacuum handle.  */
      if( rbuIsVacuum(p)==0 && p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(p->dbMain, &pIter->pDelete, pz,
            sqlite3_mprintf(
              "DELETE FROM \"%s%w\" WHERE %s", zWrite, zTbl, zWhere
            )
        );
      }

      if( rbuIsVacuum(p)==0 && pIter->abIndexed ){
        const char *zRbuRowid = "";
        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          zRbuRowid = ", rbu_rowid";
        }

        /* Create the rbu_tmp_xxx table and the triggers to populate it. */
        rbuMPrintfExec(p, p->dbRbu,
            "CREATE TABLE IF NOT EXISTS %s.'rbu_tmp_%q' AS "
            "SELECT *%s FROM '%q' WHERE 0;"
            , p->zStateDb, pIter->zDataTbl
            , (pIter->eType==RBU_PK_EXTERNAL ? ", 0 AS rbu_rowid" : "")
            , pIter->zDataTbl
        );

        rbuMPrintfExec(p, p->dbMain,
            "CREATE TEMP TRIGGER rbu_delete_tr BEFORE DELETE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(3, %s);"
            "END;"

            "CREATE TEMP TRIGGER rbu_update1_tr BEFORE UPDATE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(3, %s);"
            "END;"

            "CREATE TEMP TRIGGER rbu_update2_tr AFTER UPDATE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(4, %s);"
            "END;",
            zWrite, zTbl, zOldlist,
            zWrite, zTbl, zOldlist,
            zWrite, zTbl, zNewlist
        );

        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          rbuMPrintfExec(p, p->dbMain,
              "CREATE TEMP TRIGGER rbu_insert_tr AFTER INSERT ON \"%s%w\" "
              "BEGIN "
              "  SELECT rbu_tmp_insert(0, %s);"
              "END;",
              zWrite, zTbl, zNewlist
          );
        }

        rbuObjIterPrepareTmpInsert(p, pIter, zCollist, zRbuRowid);
      }

      /* Create the SELECT statement to read keys from data_xxx */
      if( p->rc==SQLITE_OK ){
        const char *zRbuRowid = "";
        if( bRbuRowid ){
          zRbuRowid = rbuIsVacuum(p) ? ",_rowid_ " : ",rbu_rowid";
        }
        p->rc = prepareFreeAndCollectError(p->dbRbu, &pIter->pSelect, pz,
            sqlite3_mprintf(
              "SELECT %s,%s rbu_control%s FROM '%q'%s", 
              zCollist, 
              (rbuIsVacuum(p) ? "0 AS " : ""),
              zRbuRowid,
              pIter->zDataTbl, zLimit
            )
        );
      }

      sqlite3_free(zWhere);
      sqlite3_free(zOldlist);
      sqlite3_free(zNewlist);
      sqlite3_free(zBindings);
    }
    sqlite3_free(zCollist);
    sqlite3_free(zLimit);
  }
  
  return p->rc;
}